

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_ManFaultDumpNewFaults
              (Gia_Man_t *pM,int nFuncVars,Vec_Int_t *vTests,Vec_Int_t *vTestNew,Bmc_ParFf_t *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  abctime aVar4;
  Vec_Int_t *p_00;
  abctime aVar5;
  abctime local_80;
  int nNewFaults;
  int IterMax;
  int Iter;
  int i;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf2;
  Gia_Man_t *pC;
  abctime clk;
  char *pFileName;
  Bmc_ParFf_t *pPars_local;
  Vec_Int_t *vTestNew_local;
  Vec_Int_t *vTests_local;
  int nFuncVars_local;
  Gia_Man_t *pM_local;
  
  p = Gia_ManFaultCofactor(pM,vTestNew);
  pCnf = Cnf_DeriveGiaRemapped(p);
  s = sat_solver_new();
  sat_solver_setnvars(s,1);
  if (pPars->nTimeOut == 0) {
    local_80 = 0;
  }
  else {
    iVar1 = pPars->nTimeOut;
    aVar4 = Abc_Clock();
    local_80 = (long)iVar1 * 1000000 + aVar4;
  }
  sat_solver_set_runtime_limit(s,local_80);
  Gia_ManFaultAddOne(pM,(Cnf_Dat_t *)0x0,s,vTestNew,nFuncVars,1,(Gia_Man_t *)0x0);
  iVar1 = Vec_IntSize(vTests);
  if (iVar1 % nFuncVars == 0) {
    iVar1 = Vec_IntSize(vTests);
    p_00 = Vec_IntAlloc(nFuncVars);
    nNewFaults = 0;
    while( true ) {
      if (iVar1 / nFuncVars <= nNewFaults) {
        Vec_IntFree(p_00);
        aVar4 = Abc_Clock();
        uVar3 = Gia_ManDumpUntests(p,pCnf,s,nFuncVars,"newfaults.txt",pPars->fVerbose);
        printf("Dumped %d new multiple faults into file \"%s\".  ",(ulong)uVar3,"newfaults.txt");
        aVar5 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar5 - aVar4);
        sat_solver_delete(s);
        Cnf_DataFree(pCnf);
        Gia_ManStop(p);
        return 1;
      }
      Vec_IntClear(p_00);
      for (IterMax = 0; IterMax < nFuncVars; IterMax = IterMax + 1) {
        iVar2 = Vec_IntEntry(vTests,nNewFaults * nFuncVars + IterMax);
        Vec_IntPush(p_00,iVar2);
      }
      iVar2 = Gia_ManFaultAddOne(pM,pCnf,s,p_00,nFuncVars,0,p);
      if (iVar2 == 0) break;
      nNewFaults = nNewFaults + 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x53c,
                  "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                 );
  }
  __assert_fail("Vec_IntSize(vTests) % nFuncVars == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x530,
                "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
               );
}

Assistant:

int Gia_ManFaultDumpNewFaults( Gia_Man_t * pM, int nFuncVars, Vec_Int_t * vTests, Vec_Int_t * vTestNew, Bmc_ParFf_t * pPars )
{
    char * pFileName = "newfaults.txt";
    abctime clk;
    Gia_Man_t * pC;
    Cnf_Dat_t * pCnf2;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, Iter, IterMax, nNewFaults;

    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vTestNew );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );

    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    // create the first cofactor
    Gia_ManFaultAddOne( pM, NULL, pSat, vTestNew, nFuncVars, 1, NULL );

    // add other test patterns
    assert( Vec_IntSize(vTests) % nFuncVars == 0 );
    IterMax = Vec_IntSize(vTests) / nFuncVars;
    vLits = Vec_IntAlloc( nFuncVars );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        // get pattern
        Vec_IntClear( vLits );
        for ( i = 0; i < nFuncVars; i++ )
            Vec_IntPush( vLits, Vec_IntEntry(vTests, Iter*nFuncVars + i) );
        // the resulting problem cannot be UNSAT, because the new test is guaranteed 
        // to detect something that the given test set does not detect
        if ( !Gia_ManFaultAddOne( pM, pCnf2, pSat, vLits, nFuncVars, 0, pC ) )
            assert( 0 );
    }
    Vec_IntFree( vLits );

    // dump the new faults
    clk = Abc_Clock();
    nNewFaults = Gia_ManDumpUntests( pC, pCnf2, pSat, nFuncVars, pFileName, pPars->fVerbose );
    printf( "Dumped %d new multiple faults into file \"%s\".  ", nNewFaults, pFileName );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}